

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O2

void av1_highbd_iwht4x4_16_add_c(tran_low_t *input,uint8_t *dest8,int stride,int bd)

{
  uint16_t uVar1;
  long lVar2;
  int iVar3;
  uint16_t *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  tran_low_t output [16];
  int aiStack_78 [8];
  int aiStack_58 [4];
  int aiStack_48 [6];
  
  puVar4 = (uint16_t *)((long)dest8 * 2);
  for (lVar2 = 0; (int)lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar3 = (input[lVar2] >> 2) + (input[lVar2 + 4] >> 2);
    iVar5 = (input[lVar2 + 8] >> 2) - (input[lVar2 + 0xc] >> 2);
    iVar6 = iVar3 - iVar5 >> 1;
    iVar7 = iVar6 - (input[lVar2 + 0xc] >> 2);
    iVar6 = iVar6 - (input[lVar2 + 4] >> 2);
    aiStack_78[lVar2] = iVar3 - iVar7;
    aiStack_78[lVar2 + 4] = iVar7;
    aiStack_58[lVar2] = iVar6;
    aiStack_48[lVar2] = iVar5 + iVar6;
  }
  for (lVar2 = 0; (int)lVar2 != 0x20; lVar2 = lVar2 + 8) {
    iVar3 = *(int *)((long)aiStack_78 + lVar2 * 2 + 4);
    iVar5 = *(int *)((long)aiStack_78 + lVar2 * 2 + 0xc);
    iVar6 = *(int *)((long)aiStack_78 + lVar2 * 2) + iVar3;
    iVar8 = *(int *)((long)aiStack_78 + lVar2 * 2 + 8) - iVar5;
    iVar7 = iVar6 - iVar8 >> 1;
    iVar5 = iVar7 - iVar5;
    iVar7 = iVar7 - iVar3;
    uVar1 = highbd_clip_pixel_add(*puVar4,(long)(iVar6 - iVar5),bd);
    *puVar4 = uVar1;
    uVar1 = highbd_clip_pixel_add(puVar4[stride],(long)iVar5,bd);
    puVar4[stride] = uVar1;
    uVar1 = highbd_clip_pixel_add(puVar4[stride * 2],(long)iVar7,bd);
    puVar4[stride * 2] = uVar1;
    uVar1 = highbd_clip_pixel_add(puVar4[stride * 3],(long)(iVar8 + iVar7),bd);
    puVar4[stride * 3] = uVar1;
    puVar4 = puVar4 + 1;
  }
  return;
}

Assistant:

void av1_highbd_iwht4x4_16_add_c(const tran_low_t *input, uint8_t *dest8,
                                 int stride, int bd) {
  /* 4-point reversible, orthonormal inverse Walsh-Hadamard in 3.5 adds,
     0.5 shifts per pixel. */
  int i;
  tran_low_t output[16];
  tran_low_t a1, b1, c1, d1, e1;
  const tran_low_t *ip = input;
  tran_low_t *op = output;
  uint16_t *dest = CONVERT_TO_SHORTPTR(dest8);

  for (i = 0; i < 4; i++) {
    a1 = ip[4 * 0] >> UNIT_QUANT_SHIFT;
    c1 = ip[4 * 1] >> UNIT_QUANT_SHIFT;
    d1 = ip[4 * 2] >> UNIT_QUANT_SHIFT;
    b1 = ip[4 * 3] >> UNIT_QUANT_SHIFT;
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    op[4 * 0] = a1;
    op[4 * 1] = b1;
    op[4 * 2] = c1;
    op[4 * 3] = d1;
    ip++;
    op++;
  }

  ip = output;
  for (i = 0; i < 4; i++) {
    a1 = ip[0];
    c1 = ip[1];
    d1 = ip[2];
    b1 = ip[3];
    a1 += c1;
    d1 -= b1;
    e1 = (a1 - d1) >> 1;
    b1 = e1 - b1;
    c1 = e1 - c1;
    a1 -= b1;
    d1 += c1;

    range_check_value(a1, bd + 1);
    range_check_value(b1, bd + 1);
    range_check_value(c1, bd + 1);
    range_check_value(d1, bd + 1);

    dest[stride * 0] = highbd_clip_pixel_add(dest[stride * 0], a1, bd);
    dest[stride * 1] = highbd_clip_pixel_add(dest[stride * 1], b1, bd);
    dest[stride * 2] = highbd_clip_pixel_add(dest[stride * 2], c1, bd);
    dest[stride * 3] = highbd_clip_pixel_add(dest[stride * 3], d1, bd);

    ip += 4;
    dest++;
  }
}